

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  size_type sVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar3;
  StringRef op_local;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)op.m_size;
  op_local.m_size = (size_type)op.m_start;
  op_local.m_start = (char *)lhs;
  if (this_00->_M_string_length + *(long *)(os + 8) < 0x28) {
    sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)os,'\n',0);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              ::find(this_00,'\n',0);
      if (sVar1 == 0xffffffffffffffff) {
        pcVar3 = " ";
        goto LAB_00460da7;
      }
    }
  }
  pcVar3 = "\n";
LAB_00460da7:
  poVar2 = std::operator<<((ostream *)this,(string *)os);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = operator<<(poVar2,&op_local);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)this_00);
  return;
}

Assistant:

void formatReconstructedExpression(std::ostream &os, std::string const &lhs, StringRef op, std::string const &rhs) {
    if (lhs.size() + rhs.size() < 40 && lhs.find('\n') == std::string::npos && rhs.find('\n') == std::string::npos)
      os << lhs << " " << op << " " << rhs;
    else
      os << lhs << "\n"
         << op << "\n"
         << rhs;
  }